

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O3

bool __thiscall LSM_tree::find(LSM_tree *this,uint64_t key)

{
  Level *pLVar1;
  Sstable *pSVar2;
  bool bVar3;
  pointer ppLVar4;
  pointer ppSVar5;
  ulong uVar6;
  pointer ppSVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bool del;
  int id;
  string result;
  Level level;
  Sstable sstable;
  bool local_c5;
  int local_c4;
  LSM_tree *local_c0;
  string local_b8;
  undefined8 local_98;
  bool *pbStack_90;
  vector<Sstable_*,_std::allocator<Sstable_*>_> local_88;
  Sstable local_68;
  pairs local_48;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_c5 = false;
  local_c0 = this;
  bVar3 = Skiplist::has_key(&this->memtable,key,&local_c5,&local_b8);
  if (bVar3) {
    uVar9 = (uint)(local_c5 ^ 1);
  }
  else {
    ppLVar4 = (local_c0->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar9 = 0;
    if ((local_c0->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppLVar4) {
      uVar6 = 0;
      uVar10 = 0;
      bVar8 = 0;
      do {
        pLVar1 = ppLVar4[uVar6];
        local_98 = *(undefined8 *)pLVar1;
        pbStack_90 = pLVar1->is_creat;
        std::vector<Sstable_*,_std::allocator<Sstable_*>_>::vector(&local_88,&pLVar1->file);
        ppSVar7 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar11 = 0;
          ppSVar5 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          do {
            pSVar2 = ppSVar7[uVar11];
            if (pSVar2 != (Sstable *)0x0) {
              local_68.end = pSVar2->end;
              std::vector<pairs_*,_std::allocator<pairs_*>_>::vector
                        (&local_68.buffer,&pSVar2->buffer);
              local_48.key = 0;
              local_48.offset = 0;
              local_48.timer = 0;
              local_48._16_4_ = local_48._16_4_ & 0xffffff00;
              local_c4 = 0;
              bVar3 = Sstable::find(&local_68,key,&local_48,&local_c4);
              if (bVar3) {
                uVar10 = uVar10 & 0xff;
                if (uVar9 < local_48.timer) {
                  uVar9 = local_48.timer;
                  uVar10 = local_48._16_4_;
                }
                bVar8 = 1;
              }
              ppSVar5 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              ppSVar7 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (local_68.buffer.super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_68.buffer.
                                super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_68.buffer.
                                      super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_68.buffer.
                                      super__Vector_base<pairs_*,_std::allocator<pairs_*>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                ppSVar5 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl
                          .super__Vector_impl_data._M_finish;
                ppSVar7 = local_88.super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>._M_impl
                          .super__Vector_impl_data._M_start;
              }
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < (ulong)((long)ppSVar5 - (long)ppSVar7 >> 3));
        }
        if (ppSVar7 != (pointer)0x0) {
          operator_delete(ppSVar7,(long)local_88.
                                        super__Vector_base<Sstable_*,_std::allocator<Sstable_*>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)ppSVar7);
        }
        uVar6 = uVar6 + 1;
        ppLVar4 = (local_c0->disk).super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(local_c0->disk).
                                     super__Vector_base<Level_*,_std::allocator<Level_*>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)ppLVar4 >> 3));
      uVar9 = (uint)(bVar8 & ((byte)uVar10 ^ 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return (bool)((byte)uVar9 & 1);
}

Assistant:

bool LSM_tree::find(uint64_t key) {
    //-----------------------------------先去memtable里找--------------------------//

    //声明：如果memtable里存了一个标记被删了的pair 那么memtable.get是会返回NULL的 也就是没找到
//    if ((memtable.get(key)) != nullptr) {
//        return true;
//    }
    std::string result;
//    if ((result = memtable.get(key)) != nullptr) {
//        return *result;
//    }
    bool del = false;
    bool has_key = memtable.has_key(key, del, result);
    if (has_key) {
        if (del) {
            return false;
        } else
            return true;
    }

    bool has = false;
    unsigned int ans_timer = 0;
    bool ans_del = false;
    for (int i = 0; i < disk.size(); i++) {

        if (disk.size() == 0) return false;
        //每层里 一个文件一个文件找 -----在索引里
        Level level = *disk[i];
        for (int j = 0; j < level.file.size(); j++) {
            if (level.file[j] == nullptr) continue;
            Sstable sstable = *(level.file[j]);

            pairs temp(0, 0, 0, false);

            //标记为删了的不能返回true哦！
            int id = 0;

            bool is_find = sstable.find(key, temp, id);

            if (is_find) {
                has = true;
                if (temp.timer > ans_timer) {
                    ans_timer = temp.timer;
                    ans_del = temp.del;

                }

            }

        }
    }

    if (!has) {
        return false;
    } else {
        if (ans_del) return false;
        return true;

    }


}